

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

void __thiscall Gluco::SimpSolver::garbageCollect(SimpSolver *this)

{
  ClauseAllocator to;
  ClauseAllocator local_28;
  
  ClauseAllocator::ClauseAllocator
            (&local_28,
             (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz -
             (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_);
  cleanUpClauses(this);
  local_28.super_RegionAllocator<unsigned_int>._20_1_ =
       (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14;
  relocAll(this,&local_28);
  Solver::relocAll(&this->super_Solver,&local_28);
  if (1 < (this->super_Solver).verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz << 2),
           (ulong)(local_28.super_RegionAllocator<unsigned_int>.sz << 2));
  }
  ClauseAllocator::moveTo(&local_28,&(this->super_Solver).ca);
  free(local_28.super_RegionAllocator<unsigned_int>.memory);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    cleanUpClauses();
    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}